

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

void al_destroy_path(ALLEGRO_PATH *path)

{
  ALLEGRO_USTR *us;
  ulong uVar1;
  
  if (path != (ALLEGRO_PATH *)0x0) {
    if (path->drive != (ALLEGRO_USTR *)0x0) {
      al_ustr_free(path->drive);
      path->drive = (ALLEGRO_USTR *)0x0;
    }
    if (path->filename != (ALLEGRO_USTR *)0x0) {
      al_ustr_free(path->filename);
      path->filename = (ALLEGRO_USTR *)0x0;
    }
    for (uVar1 = 0; uVar1 < (path->segments)._size; uVar1 = (ulong)((uint)uVar1 + 1)) {
      us = get_segment(path,(uint)uVar1);
      al_ustr_free(us);
    }
    _al_vector_free(&path->segments);
    if (path->basename != (ALLEGRO_USTR *)0x0) {
      al_ustr_free(path->basename);
      path->basename = (ALLEGRO_USTR *)0x0;
    }
    if (path->full_string != (ALLEGRO_USTR *)0x0) {
      al_ustr_free(path->full_string);
      path->full_string = (ALLEGRO_USTR *)0x0;
    }
    al_free_with_context
              (path,0x1ce,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/path.c"
               ,"al_destroy_path");
    return;
  }
  return;
}

Assistant:

void al_destroy_path(ALLEGRO_PATH *path)
{
   unsigned i;

   if (!path) {
      return;
   }

   if (path->drive) {
      al_ustr_free(path->drive);
      path->drive = NULL;
   }

   if (path->filename) {
      al_ustr_free(path->filename);
      path->filename = NULL;
   }

   for (i = 0; i < _al_vector_size(&path->segments); i++) {
      al_ustr_free(get_segment(path, i));
   }
   _al_vector_free(&path->segments);

   if (path->basename) {
      al_ustr_free(path->basename);
      path->basename = NULL;
   }

   if (path->full_string) {
      al_ustr_free(path->full_string);
      path->full_string = NULL;
   }

   al_free(path);
}